

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wapiti_wrap.cxx
# Opt level: O0

void Java_fr_limsi_wapiti_WapitiJNI_opt_1s_1nbest_1set
               (JNIEnv *jenv,jclass jcls,jlong jarg1,jobject jarg1_,jlong jarg2)

{
  JNIEnv *in_RCX;
  char *in_RDX;
  undefined4 *in_R8;
  uint32_t *argp2;
  uint32_t arg2;
  opt_s *arg1;
  
  if (in_R8 == (undefined4 *)0x0) {
    SWIG_JavaThrowException(in_RCX,0,in_RDX);
  }
  else if (in_RDX != (char *)0x0) {
    *(undefined4 *)(in_RDX + 0xdc) = *in_R8;
  }
  return;
}

Assistant:

SWIGEXPORT void JNICALL Java_fr_limsi_wapiti_WapitiJNI_opt_1s_1nbest_1set(JNIEnv *jenv, jclass jcls, jlong jarg1, jobject jarg1_, jlong jarg2) {
  opt_s *arg1 = (opt_s *) 0 ;
  uint32_t arg2 ;
  uint32_t *argp2 ;
  
  (void)jenv;
  (void)jcls;
  (void)jarg1_;
  arg1 = *(opt_s **)&jarg1; 
  argp2 = *(uint32_t **)&jarg2; 
  if (!argp2) {
    SWIG_JavaThrowException(jenv, SWIG_JavaNullPointerException, "Attempt to dereference null uint32_t");
    return ;
  }
  arg2 = *argp2; 
  if (arg1) (arg1)->nbest = arg2;
}